

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_reader.cpp
# Opt level: O3

void duckdb::TemplatedListReader::HandleNull(DATA *data,idx_t offset)

{
  ValidityMask *pVVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  list_entry_t *plVar2;
  byte bVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  TemplatedValidityData<unsigned_long> *pTVar6;
  _Head_base<0UL,_unsigned_long_*,_false> _Var7;
  idx_t idx_in_entry;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  _Head_base<0UL,_unsigned_long_*,_false> local_30;
  
  pVVar1 = data->result_mask;
  _Var7._M_head_impl = (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (_Var7._M_head_impl == (unsigned_long *)0x0) {
    local_30._M_head_impl =
         (unsigned_long *)(pVVar1->super_TemplatedValidityMask<unsigned_long>).capacity;
    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
              ((duckdb *)&local_48,(unsigned_long *)&local_30);
    p_Var5 = p_Stack_40;
    peVar4 = local_48;
    local_48 = (element_type *)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this = (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
    (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar4;
    (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var5;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
      }
    }
    pTVar6 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                       (&(pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_data);
    _Var7._M_head_impl =
         (pTVar6->owned_data).
         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var7._M_head_impl;
  }
  bVar3 = (byte)offset & 0x3f;
  _Var7._M_head_impl[offset >> 6] =
       _Var7._M_head_impl[offset >> 6] & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
  plVar2 = data->result_ptr;
  plVar2[offset].offset = 0;
  plVar2[offset].length = 0;
  return;
}

Assistant:

static void HandleNull(DATA &data, idx_t offset) {
		data.result_mask.SetInvalid(offset);
		data.result_ptr[offset].offset = 0;
		data.result_ptr[offset].length = 0;
	}